

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpChunkedEntityReader::tryRead
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  long *plVar1;
  PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *__return_storage_ptr__;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr___00;
  Array<char> *this_01;
  HttpInputStreamImpl *this_02;
  HttpInputStreamImpl *this_03;
  HttpEntityBodyReader *this_04;
  long lVar2;
  unsigned_long value;
  SourceLocation location;
  bool bVar3;
  coroutine_handle<void> handle;
  HttpInputStreamImpl *buffer_00;
  DebugExpression<bool> *pDVar4;
  DebugExpression<bool> *pDVar5;
  char (*params) [28];
  DebugExpression<bool> *params_00;
  long in_R8;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  
  handle._M_fr_ptr = operator_new(0x698);
  *(code **)handle._M_fr_ptr = tryRead;
  *(code **)((long)handle._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  *(void **)((long)handle._M_fr_ptr + 0x660) = buffer;
  _kjCondition.value = (bool *)anon_var_dwarf_9a3139;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7fd;
  location.columnNumber = 0x13;
  kj::_::Coroutine<unsigned_long>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  _kjCondition.value = (bool *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7fe,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               &_kjCondition,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&f);
  }
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)handle._M_fr_ptr + 0x240);
  __return_storage_ptr___00 = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x438);
  this_01 = (Array<char> *)((long)handle._M_fr_ptr + 0x638);
  this_02 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x650);
  this_03 = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x658);
  params_00 = (DebugExpression<bool> *)((long)handle._M_fr_ptr + 0x691);
  *_kjCondition.value = false;
  pDVar5 = (DebugExpression<bool> *)0x0;
  pDVar4 = params_00;
  while( true ) {
    *(DebugExpression<bool> **)((long)handle._M_fr_ptr + 0x688) = pDVar4;
    *(size_t *)((long)handle._M_fr_ptr + 0x680) = minBytes;
    *(size_t *)((long)handle._M_fr_ptr + 0x678) = maxBytes;
    *(DebugExpression<bool> **)((long)handle._M_fr_ptr + 0x670) = pDVar5;
    *(long *)((long)handle._M_fr_ptr + 0x668) = in_R8;
    while( true ) {
      this_04 = *(HttpEntityBodyReader **)((long)handle._M_fr_ptr + 0x660);
      if ((this_04->weakInner).ptr == (HttpInputStreamImpl *)0x0) {
        value = *(unsigned_long *)((long)handle._M_fr_ptr + 0x670);
        *(undefined1 *)&this_04[1].weakInner.ptr = 1;
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,value);
        goto LAB_0036ab32;
      }
      if (this_04[1].super_AsyncInputStream._vptr_AsyncInputStream != (_func_int **)0x0) break;
      HttpEntityBodyReader::getInner(this_04);
      HttpInputStreamImpl::readChunkHeader(this_02);
      co_await<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>
                (__return_storage_ptr__,
                 (Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)this_02);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x690) = 0;
      bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar3) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::await_resume
                ((OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *)
                 ((long)handle._M_fr_ptr + 0x5f8),__return_storage_ptr__);
      kj::_::PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::
      ~PromiseAwaiter(__return_storage_ptr__);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
      bVar3 = ((OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *)
              ((long)handle._M_fr_ptr + 0x5f8))->tag == 1;
      params_00->value = bVar3;
      if (!bVar3) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[11]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x80a,FAILED,"nextChunkSizeOrError.is<uint64_t>()","_kjCondition,\"bad header\""
                   ,params_00,(char (*) [11])"bad header");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      lVar2 = *(long *)((long)handle._M_fr_ptr + 0x600);
      if (lVar2 == 0) {
        HttpEntityBodyReader::doneReading
                  (*(HttpEntityBodyReader **)((long)handle._M_fr_ptr + 0x660));
      }
      *(long *)(*(long *)((long)handle._M_fr_ptr + 0x660) + 0x18) = lVar2;
    }
    buffer_00 = HttpEntityBodyReader::getInner(this_04);
    params = (char (*) [28])0x1;
    HttpInputStreamImpl::tryRead(this_03,buffer_00,*(size_t *)((long)handle._M_fr_ptr + 0x680),1);
    co_await<unsigned_long>(__return_storage_ptr___00,(Promise<unsigned_long> *)this_03);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x690) = 1;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    pDVar4 = (DebugExpression<bool> *)
             kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr___00);
    kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr___00);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_03);
    plVar1 = (long *)(*(long *)((long)handle._M_fr_ptr + 0x660) + 0x18);
    *plVar1 = *plVar1 - (long)pDVar4;
    if (pDVar4 == (DebugExpression<bool> *)0x0) break;
    maxBytes = (long)*(DebugExpression<bool> **)((long)handle._M_fr_ptr + 0x678) - (long)pDVar4;
    if (*(DebugExpression<bool> **)((long)handle._M_fr_ptr + 0x678) < pDVar4 || maxBytes == 0)
    goto LAB_0036abae;
    minBytes = (size_t)(pDVar4 + *(long *)((long)handle._M_fr_ptr + 0x680));
    in_R8 = *(long *)((long)handle._M_fr_ptr + 0x668) - (long)pDVar4;
    pDVar5 = pDVar4 + *(long *)((long)handle._M_fr_ptr + 0x670);
  }
  kj::_::Debug::makeDescription<char_const(&)[28]>
            ((String *)this_01,(Debug *)"\"premature EOF in HTTP chunk\"",
             "premature EOF in HTTP chunk",params);
  Exception::Exception
            ((Exception *)&_kjCondition,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x81a,(String *)this_01);
  throwRecoverableException((Exception *)&_kjCondition,0);
  Exception::~Exception((Exception *)&_kjCondition);
  Array<char>::~Array(this_01);
LAB_0036abae:
  lVar2 = *(long *)((long)handle._M_fr_ptr + 0x670);
  *(undefined1 *)(*(long *)((long)handle._M_fr_ptr + 0x660) + 0x20) = 1;
  kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
            ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,
             (unsigned_long)(pDVar4 + lVar2));
LAB_0036ab32:
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x690) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (alreadyDone()) {
        clean = true;
        co_return alreadyRead;
      } else if (chunkSize == 0) {
        // Read next chunk header.
        auto nextChunkSizeOrError = co_await getInner().readChunkHeader();
        KJ_REQUIRE(nextChunkSizeOrError.is<uint64_t>(), "bad header");
        auto nextChunkSize = nextChunkSizeOrError.get<uint64_t>();
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        continue;
      } else {
        // Read current chunk.
        // We have to set minBytes to 1 here so that if we read any data at all, we update our
        // counter immediately, so that we still know where we are in case of cancellation.
        auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, chunkSize));

        chunkSize -= amount;
        if (amount == 0) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk"));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
        clean = true;
        co_return alreadyRead + amount;
      }
    }
  }